

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

SegmentBase<Memory::VirtualAllocWrapper> * __thiscall
DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,unsigned_long,bool>
          (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,RealCount> *this,
          NoThrowHeapAllocator *allocator,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *param1,unsigned_long param2,bool param3)

{
  NoThrowHeapAllocator *alloc;
  NodeBase *this_00;
  DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> **ppDVar1;
  TrackAllocData local_68;
  NodeBase *local_40;
  Node *newNode;
  unsigned_long uStack_30;
  bool param3_local;
  unsigned_long param2_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *param1_local;
  NoThrowHeapAllocator *allocator_local;
  DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_local;
  
  newNode._7_1_ = param3;
  uStack_30 = param2;
  param2_local = (unsigned_long)param1;
  param1_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *)allocator;
  allocator_local = (NoThrowHeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,
             (type_info *)&DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x131);
  alloc = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,&local_68);
  this_00 = (NodeBase *)new<Memory::NoThrowHeapAllocator>(0x40,alloc,0x28f8d0);
  DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>>::
  DListNode<Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,unsigned_long,bool>
            ((DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>> *)this_00,
             (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)param2_local,uStack_30,(bool)(newNode._7_1_ & 1));
  if (this_00 == (NodeBase *)0x0) {
    this_local = (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  }
  else {
    local_40 = this_00;
    ppDVar1 = DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>::Next
                        ((DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> *)this);
    DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::InsertNodeBefore
              (*ppDVar1,local_40);
    RealCount::IncrementCount((RealCount *)(this + 0x10));
    this_local = (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
                 (local_40 + 1);
  }
  return (SegmentBase<Memory::VirtualAllocWrapper> *)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }